

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O1

base_learner * gd_mf_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  uint64_t *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  typed_option<unsigned_long> *ptVar6;
  uint64_t uVar7;
  learner<gdmf,_example> *plVar8;
  vw_exception *pvVar9;
  uint32_t *puVar10;
  uint stride_shift;
  byte bVar11;
  float fVar12;
  bool conjugate_gradient;
  bool bfgs;
  free_ptr<gdmf> data;
  option_group_definition gf_md_options;
  stringstream __msg;
  bool local_502;
  bool local_501;
  free_ptr<gdmf> local_500;
  undefined1 *local_4f0 [2];
  undefined1 local_4e0 [16];
  option_group_definition local_4d0;
  undefined1 local_498 [48];
  string local_468 [64];
  bool local_428;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_410;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  undefined1 *local_310;
  long local_308;
  undefined1 local_300 [16];
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  typed_option<bool> local_210;
  typed_option<bool> local_170;
  typed_option<unsigned_int> local_d0;
  
  local_500._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>._M_head_impl
       = calloc_or_throw<gdmf>(1);
  (local_500._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>.
  _M_head_impl)->all = (vw *)0x0;
  ((local_500._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>.
   _M_head_impl)->scalars)._begin = (float *)0x0;
  ((local_500._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>.
   _M_head_impl)->scalars)._end = (float *)0x0;
  ((local_500._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>.
   _M_head_impl)->scalars).end_array = (float *)0x0;
  ((local_500._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>.
   _M_head_impl)->scalars).erase_count = 0;
  *(undefined8 *)
   &(local_500._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>.
    _M_head_impl)->rank = 0;
  (local_500._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>.
  _M_head_impl)->no_win_counter = 0;
  (local_500._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>.
  _M_head_impl)->early_stop_thres = 0;
  local_500._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<gdmf>;
  local_501 = false;
  local_502 = false;
  local_310 = local_300;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_310,"Gradient Descent Matrix Factorization","");
  local_4d0.m_name._M_dataplus._M_p = (pointer)&local_4d0.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_4d0,local_310,local_310 + local_308);
  local_4d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_310 != local_300) {
    operator_delete(local_310);
  }
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"rank","");
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_498,&local_2b0,
             &(local_500._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>
              ._M_head_impl)->rank);
  local_428 = true;
  local_4f0[0] = local_4e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4f0,"rank for matrix factorization.","");
  std::__cxx11::string::_M_assign(local_468);
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_d0,(typed_option<unsigned_int> *)local_498);
  VW::config::option_group_definition::add<unsigned_int>(&local_4d0,&local_d0);
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cc040;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_4f0[0] != local_4e0) {
    operator_delete(local_4f0[0]);
  }
  local_498._0_8_ = &PTR__typed_option_002cc040;
  if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400._M_pi);
  }
  if (local_410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_410._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"bfgs","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_498,&local_2d0,&local_501);
  local_4f0[0] = local_4e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4f0,"Option not supported by this reduction","");
  std::__cxx11::string::_M_assign(local_468);
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_498);
  VW::config::option_group_definition::add<bool>(&local_4d0,&local_170);
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbfd0;
  if (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_4f0[0] != local_4e0) {
    operator_delete(local_4f0[0]);
  }
  local_498._0_8_ = &PTR__typed_option_002cbfd0;
  if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400._M_pi);
  }
  if (local_410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_410._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"conjugate_gradient","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_498,&local_2f0,&local_502);
  local_4f0[0] = local_4e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4f0,"Option not supported by this reduction","");
  std::__cxx11::string::_M_assign(local_468);
  VW::config::typed_option<bool>::typed_option(&local_210,(typed_option<bool> *)local_498);
  VW::config::option_group_definition::add<bool>(&local_4d0,&local_210);
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbfd0;
  if (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_4f0[0] != local_4e0) {
    operator_delete(local_4f0[0]);
  }
  local_498._0_8_ = &PTR__typed_option_002cbfd0;
  if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400._M_pi);
  }
  if (local_410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_410._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_4d0);
  pp_Var1 = (_func_int **)(local_498 + 0x10);
  local_498._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"rank","");
  iVar5 = (*options->_vptr_options_i[1])(options,local_498);
  if ((_func_int **)local_498._0_8_ != pp_Var1) {
    operator_delete((void *)local_498._0_8_);
  }
  if ((char)iVar5 == '\0') {
    plVar8 = (learner<gdmf,_example> *)0x0;
  }
  else {
    local_498._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"adaptive","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_498);
    if ((_func_int **)local_498._0_8_ != pp_Var1) {
      operator_delete((void *)local_498._0_8_);
    }
    if ((char)iVar5 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_498);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_498 + 0x10),
                 "adaptive is not implemented for matrix factorization",0x34);
      pvVar9 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar9,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
                 ,0x15b,&local_230);
      __cxa_throw(pvVar9,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_498._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"normalized","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_498);
    if ((_func_int **)local_498._0_8_ != pp_Var1) {
      operator_delete((void *)local_498._0_8_);
    }
    if ((char)iVar5 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_498);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_498 + 0x10),
                 "normalized is not implemented for matrix factorization",0x36);
      pvVar9 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar9,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
                 ,0x15d,&local_250);
      __cxa_throw(pvVar9,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_498._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"exact_adaptive_norm","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_498);
    if ((_func_int **)local_498._0_8_ != pp_Var1) {
      operator_delete((void *)local_498._0_8_);
    }
    if ((char)iVar5 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_498);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_498 + 0x10),
                 "normalized adaptive updates is not implemented for matrix factorization",0x47);
      pvVar9 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar9,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
                 ,0x15f,&local_270);
      __cxa_throw(pvVar9,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    if ((local_501 != false) || (local_502 == true)) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_498);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_498 + 0x10),"bfgs is not implemented for matrix factorization",
                 0x30);
      pvVar9 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar9,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
                 ,0x162,&local_290);
      __cxa_throw(pvVar9,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    (local_500._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>.
    _M_head_impl)->all = all;
    (local_500._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>.
    _M_head_impl)->no_win_counter = 0;
    fVar12 = logf((float)((local_500._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_gdmf_*,_false>._M_head_impl)->rank * 2 + 1));
    fVar12 = ceilf(fVar12 / 0.6931472);
    stride_shift = (uint)(long)fVar12 |
                   (uint)(long)(fVar12 - 9.223372e+18) & (uint)((long)fVar12 >> 0x3f);
    if ((all->weights).sparse == true) {
      sparse_parameters::stride_shift(&(all->weights).sparse_weights,stride_shift);
    }
    else {
      (all->weights).dense_weights._stride_shift = stride_shift;
    }
    all->random_weights = true;
    if (all->holdout_set_off == false) {
      all->sd->holdout_best_loss = 3.4028234663852886e+38;
      local_498._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"early_terminate","");
      ptVar6 = VW::config::options_i::get_typed_option<unsigned_long>(options,(string *)local_498);
      puVar2 = (ptVar6->m_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (puVar2 == (uint64_t *)0x0) {
        uVar7 = 0;
      }
      else {
        uVar7 = *puVar2;
      }
      (local_500._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>.
      _M_head_impl)->early_stop_thres = uVar7;
      if ((_func_int **)local_498._0_8_ != pp_Var1) {
        operator_delete((void *)local_498._0_8_);
      }
    }
    local_498._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"learning_rate","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_498);
    if ((char)iVar5 == '\0') {
      local_4f0[0] = local_4e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,"l","");
      iVar5 = (*options->_vptr_options_i[1])(options,local_4f0);
      bVar11 = (byte)iVar5 ^ 1;
      if (local_4f0[0] != local_4e0) {
        operator_delete(local_4f0[0]);
      }
    }
    else {
      bVar11 = 0;
    }
    if ((_func_int **)local_498._0_8_ != pp_Var1) {
      operator_delete((void *)local_498._0_8_);
    }
    if (bVar11 != 0) {
      all->eta = 10.0;
    }
    local_498._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"initial_t","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_498);
    if ((_func_int **)local_498._0_8_ != pp_Var1) {
      operator_delete((void *)local_498._0_8_);
    }
    if ((char)iVar5 == '\0') {
      all->sd->t = 1.0;
      all->initial_t = 1.0;
    }
    fVar12 = powf((float)all->sd->t,all->power_t);
    all->eta = fVar12 * all->eta;
    puVar10 = &(all->weights).dense_weights._stride_shift;
    if ((all->weights).sparse != false) {
      puVar10 = &(all->weights).sparse_weights._stride_shift;
    }
    plVar8 = LEARNER::init_learner<gdmf,example,LEARNER::learner<char,example>>
                       (&local_500,learn,predict,1L << ((byte)*puVar10 & 0x3f));
    *(code **)(plVar8 + 0x80) = save_load;
    uVar3 = *(undefined8 *)(plVar8 + 0x18);
    uVar4 = *(undefined8 *)(plVar8 + 0x20);
    *(undefined8 *)(plVar8 + 0x70) = uVar3;
    *(undefined8 *)(plVar8 + 0x78) = uVar4;
    *(undefined8 *)(plVar8 + 0x88) = uVar3;
    *(undefined8 *)(plVar8 + 0x90) = uVar4;
    *(code **)(plVar8 + 0x98) = end_pass;
    *(undefined8 *)(plVar8 + 0xb8) = uVar3;
    *(undefined8 *)(plVar8 + 0xc0) = uVar4;
    *(code **)(plVar8 + 200) = finish;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_4d0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0.m_name._M_dataplus._M_p != &local_4d0.m_name.field_2) {
    operator_delete(local_4d0.m_name._M_dataplus._M_p);
  }
  if (local_500._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>.
      _M_head_impl != (gdmf *)0x0) {
    (*(code *)local_500._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_500._M_t.super___uniq_ptr_impl<gdmf,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_gdmf_*,_void_(*)(void_*)>.super__Head_base<0UL,_gdmf_*,_false>
               ._M_head_impl);
  }
  return (base_learner *)plVar8;
}

Assistant:

base_learner* gd_mf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<gdmf>();

  bool bfgs = false;
  bool conjugate_gradient = false;
  option_group_definition gf_md_options("Gradient Descent Matrix Factorization");
  gf_md_options.add(make_option("rank", data->rank).keep().help("rank for matrix factorization."));

  // Not supported, need to be checked to be false.
  gf_md_options.add(make_option("bfgs", bfgs).help("Option not supported by this reduction"));
  gf_md_options.add(
      make_option("conjugate_gradient", conjugate_gradient).help("Option not supported by this reduction"));
  options.add_and_parse(gf_md_options);

  if (!options.was_supplied("rank"))
    return nullptr;

  if (options.was_supplied("adaptive"))
    THROW("adaptive is not implemented for matrix factorization");
  if (options.was_supplied("normalized"))
    THROW("normalized is not implemented for matrix factorization");
  if (options.was_supplied("exact_adaptive_norm"))
    THROW("normalized adaptive updates is not implemented for matrix factorization");

  if (bfgs || conjugate_gradient)
    THROW("bfgs is not implemented for matrix factorization");

  data->all = &all;
  data->no_win_counter = 0;

  // store linear + 2*rank weights per index, round up to power of two
  float temp = ceilf(logf((float)(data->rank * 2 + 1)) / logf(2.f));
  all.weights.stride_shift((size_t)temp);
  all.random_weights = true;

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    data->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  if (!options.was_supplied("learning_rate") && !options.was_supplied("l"))
    all.eta = 10;  // default learning rate to 10 for non default update rule

  // default initial_t to 1 instead of 0
  if (!options.was_supplied("initial_t"))
  {
    all.sd->t = 1.f;
    all.initial_t = 1.f;
  }
  all.eta *= powf((float)(all.sd->t), all.power_t);

  learner<gdmf, example>& l = init_learner(data, learn, predict, (UINT64_ONE << all.weights.stride_shift()));
  l.set_save_load(save_load);
  l.set_end_pass(end_pass);
  l.set_finish(finish);

  return make_base(l);
}